

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.cc
# Opt level: O0

Tensor * __thiscall
cnn::SimpleExecutionEngine::forward(SimpleExecutionEngine *this,VariableIndex *i)

{
  Tensor *pTVar1;
  VariableIndex *in_RSI;
  long *in_RDI;
  VariableIndex local_14 [5];
  
  (**(code **)(*in_RDI + 0x10))();
  VariableIndex::VariableIndex(local_14,in_RSI);
  pTVar1 = (Tensor *)(**(code **)(*in_RDI + 0x30))(in_RDI,local_14);
  return pTVar1;
}

Assistant:

const Tensor& SimpleExecutionEngine::forward(VariableIndex i) {
  invalidate();
  return incremental_forward(i);
}